

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O3

TSNode * ts_tree_cursor_current_node(TSNode *__return_storage_ptr__,TSTreeCursor *_self)

{
  uint32_t uVar1;
  TSSymbol *pTVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  TSTree *pTVar7;
  uint uVar8;
  TreeCursor *self;
  ulong uVar9;
  uint uVar10;
  
  uVar1 = _self->context[0];
  if (uVar1 != 0) {
    puVar6 = (undefined8 *)((ulong)(uVar1 - 1) * 0x20 + (long)_self->id);
    if (uVar1 == 1) {
      pTVar7 = (TSTree *)_self->tree;
      uVar8 = 0;
    }
    else {
      uVar9 = (ulong)*(ushort *)(**(long **)((long)_self->id + (ulong)(uVar1 - 2) * 0x20) + 0x4c);
      pTVar7 = (TSTree *)_self->tree;
      uVar8 = 0;
      if (uVar9 != 0) {
        pTVar2 = pTVar7->language->alias_sequences;
        uVar8 = 0;
        if (pTVar2 != (TSSymbol *)0x0) {
          uVar3 = *(ulong *)*puVar6;
          if ((uVar3 & 1) == 0) {
            uVar10 = *(uint *)(uVar3 + 0x2c) >> 2;
          }
          else {
            uVar10 = (uint)(uVar3 >> 3) & 0x1fffffff;
          }
          if ((uVar10 & 1) == 0) {
            uVar8 = (uint)pTVar2[pTVar7->language->max_alias_sequence_length * uVar9 +
                                 (ulong)*(uint *)(puVar6 + 3)];
          }
        }
      }
    }
    pvVar4 = (void *)*puVar6;
    uVar5 = puVar6[1];
    uVar1 = *(uint32_t *)(puVar6 + 2);
    __return_storage_ptr__->context[0] = (uint32_t)uVar5;
    __return_storage_ptr__->context[1] = (uint32_t)((ulong)uVar5 >> 0x20);
    __return_storage_ptr__->context[2] = uVar1;
    __return_storage_ptr__->context[3] = uVar8;
    __return_storage_ptr__->id = pvVar4;
    __return_storage_ptr__->tree = pTVar7;
    return __return_storage_ptr__;
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/tree_cursor.c"
                ,0xe3,"TSNode ts_tree_cursor_current_node(const TSTreeCursor *)");
}

Assistant:

TSNode ts_tree_cursor_current_node(const TSTreeCursor *_self) {
  const TreeCursor *self = (const TreeCursor *)_self;
  TreeCursorEntry *last_entry = array_back(&self->stack);
  TSSymbol alias_symbol = 0;
  if (self->stack.size > 1) {
    TreeCursorEntry *parent_entry = &self->stack.contents[self->stack.size - 2];
    const TSSymbol *alias_sequence = ts_language_alias_sequence(
      self->tree->language,
      parent_entry->subtree->ptr->alias_sequence_id
    );
    if (alias_sequence && !ts_subtree_extra(*last_entry->subtree)) {
      alias_symbol = alias_sequence[last_entry->structural_child_index];
    }
  }
  return ts_node_new(
    self->tree,
    last_entry->subtree,
    last_entry->position,
    alias_symbol
  );
}